

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_diff.hpp
# Opt level: O0

Diffs * __thiscall
MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
diff_bisect(Diffs *__return_storage_ptr__,
           MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,Range text1,Range text2,Time deadline)

{
  int iVar1;
  Range text_range;
  Range text_range_00;
  Range text2_00;
  Range text1_00;
  Range text2_01;
  Range text1_01;
  Char CVar2;
  Char CVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Size SVar7;
  reference pvVar8;
  ConstIter CVar9;
  bool bVar10;
  Diff local_1a0;
  char *local_188;
  char *pcStack_180;
  Diff local_170;
  undefined1 local_151;
  duration local_150;
  duration local_148;
  char *pcStack_140;
  char *local_138;
  char *pcStack_130;
  int local_120;
  int local_11c;
  int y1_1;
  int x1_1;
  int k1_offset_1;
  int y2;
  int x2_1;
  int k2_offset_1;
  int k2;
  duration local_f8;
  char *pcStack_f0;
  char *local_e8;
  char *pcStack_e0;
  int local_d8;
  int local_d4;
  int x2;
  int k2_offset;
  int y1;
  int x1;
  int k1_offset;
  int k1;
  int d;
  int k2end;
  int k2start;
  int k1end;
  int k1start;
  int iStack_a4;
  bool front;
  int delta;
  int x;
  vector<int,_std::allocator<int>_> v2;
  undefined1 local_78 [8];
  vector<int,_std::allocator<int>_> v1;
  int v_length;
  int v_offset;
  int max_d;
  int text2_length;
  int text1_length;
  MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  Time deadline_local;
  Range text2_local;
  Range text1_local;
  Diffs *diffs;
  
  text2_local.from = text2.till._M_current;
  deadline_local.__d.__r = (duration)text2.from._M_current;
  CVar9 = text1.till._M_current;
  text2_local.till = text1.from._M_current;
  SVar7 = Range::size((Range *)&text2_local.till);
  iVar4 = (int)SVar7;
  SVar7 = Range::size((Range *)&deadline_local);
  iVar5 = (int)SVar7;
  iVar6 = (1 - (iVar4 + 1 + iVar5 >> 0x1f)) + iVar4 + iVar5 >> 1;
  v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
  ._4_4_ = iVar6 * 2;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_78);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)local_78,
             (long)v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_end_of_storage._4_4_);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&delta);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)&delta,
             (long)v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_end_of_storage._4_4_);
  for (iStack_a4 = 0;
      iStack_a4 <
      v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_; iStack_a4 = iStack_a4 + 1) {
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_78,(long)iStack_a4);
    *pvVar8 = -1;
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&delta,(long)iStack_a4);
    *pvVar8 = -1;
  }
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_78,(long)(iVar6 + 1));
  *pvVar8 = 0;
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&delta,(long)(iVar6 + 1));
  *pvVar8 = 0;
  k1start = iVar4 - iVar5;
  k1end._3_1_ = k1start % 2 != 0;
  k2start = 0;
  k2end = 0;
  d = 0;
  k1 = 0;
  k1_offset = 0;
  do {
    if (iVar6 <= k1_offset) {
      local_151 = 0;
      (__return_storage_ptr__->
      super__Vector_base<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
      ::vector(__return_storage_ptr__);
      local_188 = text2_local.till._M_current;
      text_range_00.till._M_current = CVar9._M_current;
      text_range_00.from._M_current = text2_local.till._M_current;
      pcStack_180 = CVar9._M_current;
      Diff::Diff(&local_170,DELETE,text_range_00);
      std::
      vector<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
      ::push_back(__return_storage_ptr__,&local_170);
      text_range.till._M_current = text2_local.from._M_current;
      text_range.from._M_current = (char *)deadline_local.__d.__r;
      Diff::Diff(&local_1a0,INSERT,text_range);
      std::
      vector<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
      ::push_back(__return_storage_ptr__,&local_1a0);
      local_151 = 1;
LAB_0010540e:
      k2_offset_1 = 1;
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&delta);
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_78)
      ;
      return __return_storage_ptr__;
    }
    for (x1 = k2start - k1_offset; x1 <= k1_offset - k2end; x1 = x1 + 2) {
      y1 = iVar6 + x1;
      if (x1 == -k1_offset) {
LAB_00104d46:
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_78,(long)(y1 + 1));
        k2_offset = *pvVar8;
      }
      else {
        if (x1 != k1_offset) {
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_78,(long)(y1 + -1));
          iVar1 = *pvVar8;
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_78,(long)(y1 + 1));
          if (iVar1 < *pvVar8) goto LAB_00104d46;
        }
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_78,(long)(y1 + -1));
        k2_offset = *pvVar8 + 1;
      }
      x2 = k2_offset - x1;
      while( true ) {
        bVar10 = false;
        if ((k2_offset < iVar4) && (bVar10 = false, x2 < iVar5)) {
          CVar2 = Range::operator[]((Range *)&text2_local.till,(long)k2_offset);
          CVar3 = Range::operator[]((Range *)&deadline_local,(long)x2);
          bVar10 = CVar2 == CVar3;
        }
        iVar1 = k2_offset;
        if (!bVar10) break;
        k2_offset = k2_offset + 1;
        x2 = x2 + 1;
      }
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_78,(long)y1);
      *pvVar8 = iVar1;
      if (iVar4 < k2_offset) {
        k2end = k2end + 2;
      }
      else if (iVar5 < x2) {
        k2start = k2start + 2;
      }
      else if (((((k1end._3_1_ & 1) != 0) && (local_d4 = (iVar6 + k1start) - x1, -1 < local_d4)) &&
               (local_d4 <
                v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage._4_4_)) &&
              (pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)&delta,(long)local_d4),
              *pvVar8 != -1)) {
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&delta,(long)local_d4);
        local_d8 = iVar4 - *pvVar8;
        if (local_d8 <= k2_offset) {
          local_e8 = text2_local.till._M_current;
          local_f8 = deadline_local.__d.__r;
          pcStack_f0 = text2_local.from._M_current;
          _k2 = deadline.__d.__r;
          text1_01.till._M_current = CVar9._M_current;
          text1_01.from._M_current = text2_local.till._M_current;
          text2_01.till._M_current = text2_local.from._M_current;
          text2_01.from._M_current = (char *)deadline_local.__d.__r;
          pcStack_e0 = CVar9._M_current;
          diff_bisectSplit(__return_storage_ptr__,this,text1_01,text2_01,k2_offset,x2,deadline);
          goto LAB_0010540e;
        }
      }
    }
    for (x2_1 = d - k1_offset; x2_1 <= k1_offset - k1; x2_1 = x2_1 + 2) {
      y2 = iVar6 + x2_1;
      if (x2_1 == -k1_offset) {
LAB_0010506a:
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&delta,(long)(y2 + 1));
        k1_offset_1 = *pvVar8;
      }
      else {
        if (x2_1 != k1_offset) {
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&delta,(long)(y2 + -1));
          iVar1 = *pvVar8;
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&delta,(long)(y2 + 1));
          if (iVar1 < *pvVar8) goto LAB_0010506a;
        }
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&delta,(long)(y2 + -1));
        k1_offset_1 = *pvVar8 + 1;
      }
      x1_1 = k1_offset_1 - x2_1;
      while( true ) {
        bVar10 = false;
        if ((k1_offset_1 < iVar4) && (bVar10 = false, x1_1 < iVar5)) {
          CVar2 = Range::operator[]((Range *)&text2_local.till,(long)((iVar4 - k1_offset_1) + -1));
          CVar3 = Range::operator[]((Range *)&deadline_local,(long)((iVar5 - x1_1) + -1));
          bVar10 = CVar2 == CVar3;
        }
        iVar1 = k1_offset_1;
        if (!bVar10) break;
        k1_offset_1 = k1_offset_1 + 1;
        x1_1 = x1_1 + 1;
      }
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&delta,(long)y2);
      *pvVar8 = iVar1;
      if (iVar4 < k1_offset_1) {
        k1 = k1 + 2;
      }
      else if (iVar5 < x1_1) {
        d = d + 2;
      }
      else if ((((k1end._3_1_ & 1) == 0) && (y1_1 = (iVar6 + k1start) - x2_1, -1 < y1_1)) &&
              ((y1_1 < v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._4_4_ &&
               (pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)local_78,(long)y1_1),
               *pvVar8 != -1)))) {
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_78,(long)y1_1);
        local_11c = *pvVar8;
        local_120 = (iVar6 + local_11c) - y1_1;
        k1_offset_1 = iVar4 - k1_offset_1;
        if (k1_offset_1 <= local_11c) {
          local_138 = text2_local.till._M_current;
          local_148 = deadline_local.__d.__r;
          pcStack_140 = text2_local.from._M_current;
          local_150 = deadline.__d.__r;
          text1_00.till._M_current = CVar9._M_current;
          text1_00.from._M_current = text2_local.till._M_current;
          text2_00.till._M_current = text2_local.from._M_current;
          text2_00.from._M_current = (char *)deadline_local.__d.__r;
          pcStack_130 = CVar9._M_current;
          diff_bisectSplit(__return_storage_ptr__,this,text1_00,text2_00,local_11c,local_120,
                           deadline);
          goto LAB_0010540e;
        }
      }
    }
    k1_offset = k1_offset + 1;
  } while( true );
}

Assistant:

Diffs diff_bisect(Range text1, Range text2, Time deadline) {
        // Cache the text lengths to prevent multiple calls.
        int text1_length = text1.size();
        int text2_length = text2.size();
        int max_d = (text1_length + text2_length + 1) / 2;
        int v_offset = max_d;
        int v_length = 2 * max_d;
        vector<int> v1;
        v1.resize(v_length);
        vector<int> v2;
        v2.resize(v_length);
        for (int x = 0; x < v_length; x++) {
            v1[x] = -1;
            v2[x] = -1;
        }
        v1[v_offset + 1] = 0;
        v2[v_offset + 1] = 0;
        int delta = text1_length - text2_length;
        // If the total number of characters is odd, then the front path will
        // collide with the reverse path.
        bool front = (delta % 2 != 0);
        // Offsets for start and end of k loop.
        // Prevents mapping of space beyond the grid.
        int k1start = 0;
        int k1end = 0;
        int k2start = 0;
        int k2end = 0;
        for (int d = 0; d < max_d; d++) {
            // Bail out if deadline is reached.
            /* TODO if (System.currentTimeMillis() > deadline) {
              break;
            } */

            // Walk the front path one step.
            for (int k1 = -d + k1start; k1 <= d - k1end; k1 += 2) {
                int k1_offset = v_offset + k1;
                int x1;
                if (k1 == -d ||
                    (k1 != d && v1[k1_offset - 1] < v1[k1_offset + 1])) {
                    x1 = v1[k1_offset + 1];
                } else {
                    x1 = v1[k1_offset - 1] + 1;
                }
                int y1 = x1 - k1;
                while (x1 < text1_length && y1 < text2_length &&
                       text1[x1] == text2[y1]) {
                    x1++;
                    y1++;
                }
                v1[k1_offset] = x1;
                if (x1 > text1_length) {
                    // Ran off the right of the graph.
                    k1end += 2;
                } else if (y1 > text2_length) {
                    // Ran off the bottom of the graph.
                    k1start += 2;
                } else if (front) {
                    int k2_offset = v_offset + delta - k1;
                    if (k2_offset >= 0 && k2_offset < v_length &&
                        v2[k2_offset] != -1) {
                        // Mirror x2 onto top-left coordinate system.
                        int x2 = text1_length - v2[k2_offset];
                        if (x1 >= x2) {
                            // Overlap detected.
                            return diff_bisectSplit(text1, text2, x1, y1,
                                                    deadline);
                        }
                    }
                }
            }

            // Walk the reverse path one step.
            for (int k2 = -d + k2start; k2 <= d - k2end; k2 += 2) {
                int k2_offset = v_offset + k2;
                int x2;
                if (k2 == -d ||
                    (k2 != d && v2[k2_offset - 1] < v2[k2_offset + 1])) {
                    x2 = v2[k2_offset + 1];
                } else {
                    x2 = v2[k2_offset - 1] + 1;
                }
                int y2 = x2 - k2;
                while (x2 < text1_length && y2 < text2_length &&
                       text1[text1_length - x2 - 1] ==
                           text2[text2_length - y2 - 1]) {
                    x2++;
                    y2++;
                }
                v2[k2_offset] = x2;
                if (x2 > text1_length) {
                    // Ran off the left of the graph.
                    k2end += 2;
                } else if (y2 > text2_length) {
                    // Ran off the top of the graph.
                    k2start += 2;
                } else if (!front) {
                    int k1_offset = v_offset + delta - k2;
                    if (k1_offset >= 0 && k1_offset < v_length &&
                        v1[k1_offset] != -1) {
                        int x1 = v1[k1_offset];
                        int y1 = v_offset + x1 - k1_offset;
                        // Mirror x2 onto top-left coordinate system.
                        x2 = text1_length - x2;
                        if (x1 >= x2) {
                            // Overlap detected.
                            return diff_bisectSplit(text1, text2, x1, y1,
                                                    deadline);
                        }
                    }
                }
            }
        }
        // Diff took too long and hit the deadline or
        // number of diffs equals number of characters, no commonality at all.
        Diffs diffs{};
        diffs.push_back(Diff{DELETE, text1});
        diffs.push_back(Diff{INSERT, text2});
        return diffs;
    }